

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseNat(WastParser *this,uint64_t *out_nat,bool is_64)

{
  ulong uVar1;
  char *s;
  Location loc;
  TokenType TVar2;
  Result RVar3;
  Literal *pLVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  Token token;
  allocator<char> local_89;
  Token local_88;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  TVar2 = Peek(this,0);
  if (TVar2 == Last_Literal) {
    Consume(&local_88,this);
    pLVar4 = Token::literal(&local_88);
    uVar1 = (pLVar4->text)._M_len;
    s = (pLVar4->text)._M_str;
    RVar3 = ParseUint64(s,s + uVar1,out_nat);
    if ((RVar3.enum_ == Error) || ((!is_64 && (*(int *)((long)out_nat + 4) != 0)))) {
      loc.filename._M_len._4_4_ = local_88.loc.filename._M_len._4_4_;
      loc.filename._M_len._0_4_ = (undefined4)local_88.loc.filename._M_len;
      loc.filename._M_str._0_4_ = local_88.loc.filename._M_str._0_4_;
      loc.filename._M_str._4_4_ = local_88.loc.filename._M_str._4_4_;
      loc.field_1.field_0.line = local_88.loc.field_1.field_0.line;
      loc.field_1.field_0.first_column = local_88.loc.field_1.field_0.first_column;
      loc.field_1.field_0.last_column = local_88.loc.field_1.field_0.last_column;
      loc.field_1._12_4_ = local_88.loc.field_1._12_4_;
      Error(this,loc,"invalid int \"%.*s\"",uVar1 & 0xffffffff,s,in_R8,in_R9);
    }
    RVar3.enum_ = Ok;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"a natural number",&local_89);
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               &local_88,&local_88.token_type_);
    RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_48,"123");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    std::__cxx11::string::_M_dispose();
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result WastParser::ParseNat(uint64_t* out_nat, bool is_64) {
  WABT_TRACE(ParseNat);
  if (!PeekMatch(TokenType::Nat)) {
    return ErrorExpected({"a natural number"}, "123");
  }

  Token token = Consume();
  std::string_view sv = token.literal().text;
  if (Failed(ParseUint64(sv, out_nat)) || (!is_64 && *out_nat > 0xffffffffu)) {
    Error(token.loc, "invalid int \"" PRIstringview "\"",
          WABT_PRINTF_STRING_VIEW_ARG(sv));
  }

  return Result::Ok;
}